

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void __thiscall
HACD::MyMicroAllocator::addMicroChunk
          (MyMicroAllocator *this,NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  long lVar7;
  MicroChunk *pMVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar6 = this->mMicroChunkCount;
  if (this->mMaxMicroChunks <= uVar6) {
    allocateMicroChunks(this);
    uVar6 = this->mMicroChunkCount;
  }
  pMVar8 = this->mMicroChunks;
  if (uVar6 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (ulong)uVar6;
    uVar10 = 0;
    do {
      if (memEnd < pMVar8[uVar10].mMemStart) {
        if ((uint)uVar10 < uVar6) {
          lVar7 = uVar9 << 5;
          do {
            uVar9 = uVar9 - 1;
            puVar2 = (undefined8 *)((long)&this->mMicroChunks[-1].mMemStart + lVar7);
            uVar3 = puVar2[1];
            uVar4 = puVar2[2];
            uVar5 = puVar2[3];
            puVar1 = (undefined8 *)((long)&this->mMicroChunks->mMemStart + lVar7);
            *puVar1 = *puVar2;
            puVar1[1] = uVar3;
            puVar1[2] = uVar4;
            puVar1[3] = uVar5;
            lVar7 = lVar7 + -0x20;
          } while ((uVar10 & 0xffffffff) < uVar9);
          pMVar8 = this->mMicroChunks;
          uVar6 = this->mMicroChunkCount;
        }
        pMVar8 = pMVar8 + uVar10;
        goto LAB_0083b7ea;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar9);
  }
  pMVar8 = pMVar8 + uVar9;
LAB_0083b7ea:
  pMVar8->mMemStart = memStart;
  pMVar8->mMemEnd = memEnd;
  pMVar8->mChunk = chunk;
  pMVar8->mPad = (NxU8 *)0x0;
  this->mLastMicroChunk = pMVar8;
  this->mMicroChunkCount = uVar6 + 1;
  return;
}

Assistant:

virtual void addMicroChunk(NxU8 *memStart,NxU8 *memEnd,MemoryChunk *chunk)
  {
    if ( mMicroChunkCount >= mMaxMicroChunks )
    {
        allocateMicroChunks();
    }

    bool inserted = false;
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( memEnd < mMicroChunks[i].mMemStart )
        {
            for (NxU32 j=mMicroChunkCount; j>i; j--)
            {
                mMicroChunks[j] = mMicroChunks[j-1];
            }
            mMicroChunks[i].set( memStart, memEnd, chunk );
			mLastMicroChunk = &mMicroChunks[i];
            mMicroChunkCount++;
            inserted = true;
            break;
        }
    }
    if ( !inserted )
    {
        mMicroChunks[mMicroChunkCount].set(memStart,memEnd,chunk);
		mLastMicroChunk = &mMicroChunks[mMicroChunkCount];
        mMicroChunkCount++;
    }
  }